

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall AggressiveBotStrategy::attackFromCountryIndex(AggressiveBotStrategy *this)

{
  Country *this_00;
  Country *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar5;
  reference ppCVar6;
  size_type sVar7;
  reference ppCVar8;
  ulong local_68;
  unsigned_long i;
  Country *neighbour;
  iterator __end4;
  iterator __begin4;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range4;
  Country *country;
  iterator __end1;
  iterator __begin1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range1;
  Country *biggestCountry;
  uint fromCountryIndex;
  AggressiveBotStrategy *this_local;
  
  biggestCountry._4_4_ = -1;
  __range1 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0;
  pvVar5 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
  __end1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar5);
  country = (Country *)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar5);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                     *)&country), bVar2) {
    ppCVar6 = __gnu_cxx::
              __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppCVar6;
    pCVar1 = this_00;
    if (__range1 != (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0) {
      iVar3 = Map::Country::getNumberOfTroops((Country *)__range1);
      iVar4 = Map::Country::getNumberOfTroops(this_00);
      pCVar1 = (Country *)__range1;
      if (iVar3 < iVar4) {
        pvVar5 = Map::Country::getAdjCountries(this_00);
        __end4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar5);
        neighbour = (Country *)
                    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar5);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                           *)&neighbour), pCVar1 = (Country *)__range1, bVar2) {
          ppCVar6 = __gnu_cxx::
                    __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                    ::operator*(&__end4);
          iVar3 = Map::Country::getPlayerOwnerID(*ppCVar6);
          iVar4 = Map::Country::getPlayerOwnerID(this_00);
          if (iVar3 != iVar4) {
            __range1 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)this_00;
          }
          __gnu_cxx::
          __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
          ::operator++(&__end4);
        }
      }
    }
    __range1 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)pCVar1;
    __gnu_cxx::
    __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
    ::operator++(&__end1);
  }
  (this->super_PlayerStrategy).from = (Country *)__range1;
  local_68 = 0;
  while( true ) {
    pvVar5 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
    sVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar5);
    if (sVar7 <= local_68) break;
    pvVar5 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
    ppCVar8 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar5,local_68);
    iVar3 = Map::Country::getCountryId(*ppCVar8);
    iVar4 = Map::Country::getCountryId((Country *)__range1);
    if (iVar3 == iVar4) {
      biggestCountry._4_4_ = (int)local_68;
    }
    local_68 = local_68 + 1;
  }
  return biggestCountry._4_4_;
}

Assistant:

int AggressiveBotStrategy::attackFromCountryIndex() {
    unsigned int fromCountryIndex = -1;
    Map::Country* biggestCountry = nullptr;
    for (auto* country : *player->getOwnedCountries()) {
        if (biggestCountry == nullptr) {
            biggestCountry = country;
        } else if (biggestCountry->getNumberOfTroops() < country->getNumberOfTroops()) {
            for (auto* neighbour : *country->getAdjCountries()) {
                if (neighbour->getPlayerOwnerID() != country->getPlayerOwnerID()) {
                    biggestCountry = country;
                }
            }
        }
    }

    from = biggestCountry;
    for (unsigned long i = 0; i < player->getOwnedCountries()->size(); i++) {
        if (player->getOwnedCountries()->at(i)->getCountryId() == biggestCountry->getCountryId()) {
            fromCountryIndex = i;
        }
    }

    return (int) fromCountryIndex;
}